

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall
QHttpThreadDelegate::finishedWithErrorSlot
          (QHttpThreadDelegate *this,NetworkError errorCode,QString *detail)

{
  long in_FS_OFFSET;
  QHttpNetworkReply local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    if (this[0x10] == (QHttpThreadDelegate)0x1) {
      QHttpNetworkReply::sslConfiguration(local_30);
      sslConfigurationChanged(this,(QSslConfiguration *)local_30);
      QSslConfiguration::~QSslConfiguration((QSslConfiguration *)local_30);
    }
    error(this,errorCode,detail);
    downloadFinished(this);
    QMetaObject::invokeMethod<>(*(QObject **)(this + 0x150),"deleteLater",QueuedConnection);
    QMetaObject::invokeMethod<>((QObject *)this,"deleteLater",QueuedConnection);
    *(undefined8 *)(this + 0x150) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::finishedWithErrorSlot(QNetworkReply::NetworkError errorCode, const QString &detail)
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::finishedWithErrorSlot() thread=" << QThread::currentThreadId() << "error=" << errorCode << detail;
#endif

#ifndef QT_NO_SSL
    if (ssl)
        emit sslConfigurationChanged(httpReply->sslConfiguration());
#endif
    emit error(errorCode,detail);
    emit downloadFinished();


    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(this, "deleteLater", Qt::QueuedConnection);
    httpReply = nullptr;
}